

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void SetSuperRound(TT_ExecContext exc,FT_F2Dot14 GridPeriod,FT_Long selector)

{
  uint uVar1;
  uint local_20;
  FT_Long selector_local;
  FT_F2Dot14 GridPeriod_local;
  TT_ExecContext exc_local;
  
  local_20 = (uint)selector;
  uVar1 = local_20 & 0xc0;
  if ((selector & 0xc0U) == 0) {
    exc->period = (long)((int)GridPeriod / 2);
  }
  else if (uVar1 == 0x40) {
    exc->period = (long)GridPeriod;
  }
  else if (uVar1 == 0x80) {
    exc->period = (long)((int)GridPeriod << 1);
  }
  else if (uVar1 == 0xc0) {
    exc->period = (long)GridPeriod;
  }
  uVar1 = local_20 & 0x30;
  if ((selector & 0x30U) == 0) {
    exc->phase = 0;
  }
  else if (uVar1 == 0x10) {
    exc->phase = exc->period / 4;
  }
  else if (uVar1 == 0x20) {
    exc->phase = exc->period / 2;
  }
  else if (uVar1 == 0x30) {
    exc->phase = (exc->period * 3) / 4;
  }
  if ((selector & 0xfU) == 0) {
    exc->threshold = exc->period + -1;
  }
  else {
    exc->threshold = ((long)(int)((local_20 & 0xf) - 4) * exc->period) / 8;
  }
  exc->period = exc->period >> 8;
  exc->phase = exc->phase >> 8;
  exc->threshold = exc->threshold >> 8;
  return;
}

Assistant:

static void
  SetSuperRound( TT_ExecContext  exc,
                 FT_F2Dot14      GridPeriod,
                 FT_Long         selector )
  {
    switch ( (FT_Int)( selector & 0xC0 ) )
    {
      case 0:
        exc->period = GridPeriod / 2;
        break;

      case 0x40:
        exc->period = GridPeriod;
        break;

      case 0x80:
        exc->period = GridPeriod * 2;
        break;

      /* This opcode is reserved, but... */
      case 0xC0:
        exc->period = GridPeriod;
        break;
    }

    switch ( (FT_Int)( selector & 0x30 ) )
    {
    case 0:
      exc->phase = 0;
      break;

    case 0x10:
      exc->phase = exc->period / 4;
      break;

    case 0x20:
      exc->phase = exc->period / 2;
      break;

    case 0x30:
      exc->phase = exc->period * 3 / 4;
      break;
    }

    if ( ( selector & 0x0F ) == 0 )
      exc->threshold = exc->period - 1;
    else
      exc->threshold = ( (FT_Int)( selector & 0x0F ) - 4 ) * exc->period / 8;

    /* convert to F26Dot6 format */
    exc->period    >>= 8;
    exc->phase     >>= 8;
    exc->threshold >>= 8;
  }